

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void DecodeCommandBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  size_t *psVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  long *plVar5;
  uint *puVar6;
  byte bVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t uVar13;
  HuffmanCode *pHVar14;
  HuffmanCode *pHVar15;
  
  uVar4 = s->num_block_types[1];
  if (1 < uVar4) {
    pHVar14 = s->block_type_trees;
    uVar9 = (s->br).bit_pos_;
    uVar12 = (s->br).val_;
    if (0x2f < uVar9) {
      (s->br).val_ = uVar12 >> 0x30;
      uVar9 = uVar9 ^ 0x30;
      (s->br).bit_pos_ = uVar9;
      plVar5 = (long *)(s->br).next_in;
      uVar12 = uVar12 >> 0x30 | *plVar5 << 0x10;
      (s->br).val_ = uVar12;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      (s->br).next_in = (uint8_t *)((long)plVar5 + 6);
    }
    uVar11 = uVar12 >> ((byte)uVar9 & 0x3f);
    pHVar14 = pHVar14 + (uVar11 & 0xff) + 0x278;
    bVar7 = pHVar14->bits;
    if (8 < bVar7) {
      uVar9 = uVar9 + 8;
      pHVar14 = pHVar14 + (((uint)(uVar11 >> 8) & 0xffffff & kBitMask[bVar7 - 8]) +
                          (uint)pHVar14->value);
      bVar7 = pHVar14->bits;
    }
    pHVar15 = s->block_len_trees;
    uVar9 = bVar7 + uVar9;
    uVar2 = pHVar14->value;
    if (0x2f < uVar9) {
      (s->br).val_ = uVar12 >> 0x30;
      plVar5 = (long *)(s->br).next_in;
      uVar12 = uVar12 >> 0x30 | *plVar5 << 0x10;
      (s->br).val_ = uVar12;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      uVar9 = uVar9 ^ 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar5 + 6);
    }
    uVar11 = uVar12 >> ((byte)uVar9 & 0x3f);
    pHVar15 = pHVar15 + (uVar11 & 0xff) + 0x18c;
    uVar10 = (uint)pHVar15->bits;
    if (8 < uVar10) {
      uVar9 = uVar9 + 8;
      pHVar15 = pHVar15 + (((uint)(uVar11 >> 8) & 0xffffff & kBitMask[pHVar15->bits - 8]) +
                          (uint)pHVar15->value);
      uVar10 = (uint)pHVar15->bits;
    }
    uVar10 = uVar10 + uVar9;
    bVar7 = kBlockLengthPrefixCode[pHVar15->value].nbits;
    uVar3 = kBlockLengthPrefixCode[pHVar15->value].offset;
    if (0x1f < uVar10) {
      uVar10 = uVar10 ^ 0x20;
      (s->br).bit_pos_ = uVar10;
      puVar6 = (uint *)(s->br).next_in;
      uVar12 = uVar12 >> 0x20 | (ulong)*puVar6 << 0x20;
      (s->br).val_ = uVar12;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 4;
      (s->br).next_in = (uint8_t *)(puVar6 + 1);
    }
    uVar9 = kBitMask[(uint)bVar7];
    (s->br).bit_pos_ = uVar10 + bVar7;
    s->block_length[1] = ((uint)(uVar12 >> ((byte)uVar10 & 0x3f)) & uVar9) + (uint)uVar3;
    if (uVar2 == 0) {
      uVar13 = s->block_type_rb[2];
    }
    else if (uVar2 == 1) {
      uVar13 = s->block_type_rb[3] + 1;
    }
    else {
      uVar13 = uVar2 - 2;
    }
    uVar9 = 0;
    if (uVar4 <= uVar13) {
      uVar9 = uVar4;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = uVar13 - uVar9;
    s->htree_command = (s->insert_copy_hgroup).htrees[uVar13 - uVar9];
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_lengths_begin == 0) {
        sVar8 = (s->insert_copy_length_block_splits).num_blocks;
      }
      else {
        sVar8 = (s->insert_copy_length_block_splits).num_blocks;
        (s->insert_copy_length_block_splits).positions_end[sVar8] = position;
        sVar8 = sVar8 + 1;
        (s->insert_copy_length_block_splits).num_blocks = sVar8;
      }
      (s->insert_copy_length_block_splits).positions_begin[sVar8] = position;
      (s->insert_copy_length_block_splits).types[sVar8] =
           (char)(int)(s->insert_copy_length_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[3];
      uVar12 = (s->insert_copy_length_block_splits).num_types;
      uVar11 = (ulong)(s->insert_copy_length_block_splits).types
                      [(s->insert_copy_length_block_splits).num_blocks] + 1;
      if (uVar11 < uVar12) {
        uVar11 = uVar12;
      }
      (s->insert_copy_length_block_splits).num_types = uVar11;
    }
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}